

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupOuts(Gia_Man_t *p)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      iVar5 = pVVar8->pArray[lVar14];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_0068898f;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_00->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) {
LAB_006889ae:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_006889ae;
      pGVar2[iVar5].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar8 = p->vCis;
    } while (lVar14 < pVVar8->nSize);
  }
  iVar5 = p->nObjs;
  if (0 < iVar5) {
    lVar15 = 8;
    lVar14 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar3 = *(ulong *)((long)pGVar2 + lVar15 + -8);
      if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
        uVar10 = *(uint *)((long)pGVar2 +
                          lVar15 + (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3);
        if (((int)uVar10 < 0) ||
           (uVar12 = *(uint *)((long)pGVar2 +
                              lVar15 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar12 < 0)) goto LAB_006889cd;
        iVar5 = Gia_ManAppendAnd(p_00,uVar10 ^ (uint)(uVar3 >> 0x1d) & 1,
                                 uVar12 ^ (uint)(uVar3 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar15) = iVar5;
        iVar5 = p->nObjs;
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar14 < iVar5);
  }
  iVar13 = p->nRegs;
  pVVar8 = p->vCos;
  iVar11 = pVVar8->nSize;
  if (iVar13 < iVar11) {
    lVar14 = 0;
    do {
      if (iVar11 <= lVar14) goto LAB_006889ec;
      iVar13 = pVVar8->pArray[lVar14];
      if ((long)iVar13 < 0) goto LAB_0068898f;
      iVar5 = p->nObjs;
      if (iVar5 <= iVar13) goto LAB_0068898f;
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_00688896;
      pGVar2 = p->pObjs + iVar13;
      uVar12 = (uint)*(undefined8 *)pGVar2;
      uVar10 = pGVar2[-(ulong)(uVar12 & 0x1fffffff)].Value;
      if ((int)uVar10 < 0) goto LAB_006889cd;
      Gia_ManAppendCo(p_00,uVar12 >> 0x1d & 1 ^ uVar10);
      lVar14 = lVar14 + 1;
      iVar13 = p->nRegs;
      pVVar8 = p->vCos;
      iVar11 = pVVar8->nSize;
    } while (lVar14 < iVar11 - iVar13);
    iVar5 = p->nObjs;
  }
  if (0 < iVar5) {
LAB_00688896:
    lVar15 = 8;
    lVar14 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar10 = *(uint *)((long)pGVar2 + lVar15 + -8);
      if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
        Gia_ManAppendCo(p_00,*(int *)(&pGVar2->field_0x0 + lVar15));
        iVar5 = p->nObjs;
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar14 < iVar5);
    iVar13 = p->nRegs;
  }
  if (0 < iVar13) {
    iVar5 = 0;
    do {
      iVar11 = p->vCos->nSize;
      uVar10 = (iVar11 - iVar13) + iVar5;
      if (((int)uVar10 < 0) || (iVar11 <= (int)uVar10)) {
LAB_006889ec:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar11 = p->vCos->pArray[uVar10];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) {
LAB_0068898f:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar11;
      uVar12 = (uint)*(undefined8 *)pGVar2;
      uVar10 = pGVar2[-(ulong)(uVar12 & 0x1fffffff)].Value;
      if ((int)uVar10 < 0) {
LAB_006889cd:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar12 >> 0x1d & 1 ^ uVar10);
      iVar5 = iVar5 + 1;
      iVar13 = p->nRegs;
    } while (iVar5 < iVar13);
  }
  Gia_ManSetRegNum(p_00,iVar13);
  iVar5 = Gia_ManIsNormalized(p_00);
  if (iVar5 != 0) {
    return p_00;
  }
  __assert_fail("Gia_ManIsNormalized(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                ,0xca4,"Gia_Man_t *Gia_ManDupOuts(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupOuts( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachAnd( p, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( Gia_ManIsNormalized(pNew) );
    return pNew;
}